

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O3

SUNErrCode SUNNonlinSolSetDamping_FixedPoint(SUNNonlinearSolver NLS,sunrealtype beta)

{
  void *pvVar1;
  bool bVar2;
  
  bVar2 = beta < 1.0;
  pvVar1 = NLS->content;
  if (1.0 <= beta) {
    beta = 1.0;
  }
  *(sunrealtype *)((long)pvVar1 + 0x28) = beta;
  *(uint *)((long)pvVar1 + 0x20) = (uint)bVar2;
  return 0;
}

Assistant:

SUNErrCode SUNNonlinSolSetDamping_FixedPoint(SUNNonlinearSolver NLS,
                                             sunrealtype beta)
{
  SUNFunctionBegin(NLS->sunctx);
  SUNAssert(beta > 0, SUN_ERR_ARG_OUTOFRANGE);

  if (beta < ONE)
  {
    /* enable damping */
    FP_CONTENT(NLS)->beta    = beta;
    FP_CONTENT(NLS)->damping = SUNTRUE;
  }
  else
  {
    /* disable damping */
    FP_CONTENT(NLS)->beta    = ONE;
    FP_CONTENT(NLS)->damping = SUNFALSE;
  }

  return SUN_SUCCESS;
}